

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

IceTBoolean icetMatrixInverseTranspose(IceTDouble *matrix_in,IceTDouble *matrix_out)

{
  IceTBoolean IVar1;
  IceTBoolean success;
  IceTDouble inverse [16];
  IceTDouble *matrix_out_local;
  IceTDouble *matrix_in_local;
  
  IVar1 = icetMatrixInverse(matrix_in,(IceTDouble *)&stack0xffffffffffffff58);
  if (IVar1 != '\0') {
    icetMatrixTranspose((IceTDouble *)&stack0xffffffffffffff58,matrix_out);
  }
  return IVar1 != '\0';
}

Assistant:

IceTBoolean icetMatrixInverseTranspose(const IceTDouble *matrix_in,
                                       IceTDouble *matrix_out)
{
    IceTDouble inverse[16];
    IceTBoolean success;

    success = icetMatrixInverse(matrix_in, inverse);
    if (!success) return ICET_FALSE;

    icetMatrixTranspose((const IceTDouble *)inverse, matrix_out);
    return ICET_TRUE;
}